

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O3

int lj_ffh_bit_tobit(lua_State *L)

{
  TValue *pTVar1;
  uint64_t uVar2;
  CTypeID id;
  CTypeID local_c;
  
  local_c = 0;
  pTVar1 = L->base;
  uVar2 = lj_carith_check64(L,1,&local_c);
  pTVar1[-1].n = (double)(int)uVar2;
  return 2;
}

Assistant:

LJLIB_ASM(bit_tobit)		LJLIB_REC(bit_tobit)
{
#if LJ_HASFFI
  CTypeID id = 0;
  setintV(L->base-1-LJ_FR2, (int32_t)lj_carith_check64(L, 1, &id));
  return FFH_RES(1);
#else
  lj_lib_checknumber(L, 1);
  return FFH_RETRY;
#endif
}